

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O3

void __thiscall indigox::ElectronOpt::DetermineElectronsToAdd(ElectronOpt *this)

{
  long *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint uVar5;
  runtime_error *this_00;
  AdjList *g_1;
  StoredVertexList *pSVar6;
  long *plVar7;
  AdjList *g;
  StoredVertexList *pSVar8;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  peVar2 = (this->molGraph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar5 = -(int)peVar2->totalCharge_;
  this->electronsToAdd_ = uVar5;
  peVar3 = (peVar2->super__MolGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  plVar7 = *(long **)&((StoredVertexList *)((long)&peVar3->super_type + 0x18))->
                      super__List_base<void_*,_std::allocator<void_*>_>;
  pSVar8 = (StoredVertexList *)((long)&peVar3->super_type + 0x18);
  if ((StoredVertexList *)plVar7 != pSVar8) {
    do {
      Atom::GetElement(*(Atom **)(plVar7[2] + 0x30));
      this->electronsToAdd_ = this->electronsToAdd_ + (uint)*(byte *)(local_30 + 0x43);
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      plVar7 = (long *)*plVar7;
    } while ((StoredVertexList *)plVar7 != pSVar8);
    uVar5 = this->electronsToAdd_;
  }
  peVar4 = (((this->elnGraph_).
             super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super__ElnGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  plVar7 = *(long **)&((StoredVertexList *)((long)&peVar4->super_type + 0x18))->
                      super__List_base<void_*,_std::allocator<void_*>_>;
  pSVar6 = (StoredVertexList *)((long)&peVar4->super_type + 0x18);
  if ((StoredVertexList *)plVar7 != pSVar6) {
    do {
      plVar1 = plVar7 + 2;
      plVar7 = (long *)*plVar7;
      uVar5 = uVar5 - *(byte *)(*plVar1 + 0x47);
    } while ((StoredVertexList *)plVar7 != pSVar6);
    this->electronsToAdd_ = uVar5;
  }
  if (Options::AssignElectrons::AUTO_USE_ELECTRON_PAIRS == true) {
    if ((uVar5 & 1) != 0) {
      Options::AssignElectrons::USE_ELECTRON_PAIRS = false;
      return;
    }
    Options::AssignElectrons::USE_ELECTRON_PAIRS = true;
  }
  else if ((Options::AssignElectrons::USE_ELECTRON_PAIRS & 1U) == 0) {
    return;
  }
  if ((uVar5 & 1) == 0) {
    this->electronsToAdd_ = uVar5 >> 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Unable to handle odd number of electrons when using electron pairs.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ElectronOpt::DetermineElectronsToAdd() {
  electronsToAdd_ = -molGraph_->GetTotalCharge();
  MolVertIterPair vs = molGraph_->GetVertices();
  for (MolVertexIter v = vs.first; v != vs.second; ++v)
    electronsToAdd_ += molGraph_->GetProperties(*v)->atom->GetElement()->GetValenceElectronCount();
  // All bonds should have order of at least 1
  // Preplace code
  ElnVertIterPair elnvs = elnGraph_->GetVertices();
  for (; elnvs.first != elnvs.second; ++elnvs.first)
    electronsToAdd_ -= elnGraph_->GetProperties(*elnvs.first)->pre_placed;
  //electronsToAdd_ -= 2 * molGraph_->NumEdges();
  // End Preplace code
  
  if (opt_::AUTO_USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    opt_::USE_ELECTRON_PAIRS = false;
  else if (opt_::AUTO_USE_ELECTRON_PAIRS)
    opt_::USE_ELECTRON_PAIRS = true;
  
  if (opt_::USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    throw std::runtime_error("Unable to handle odd number of electrons when using electron pairs.");
  else if (opt_::USE_ELECTRON_PAIRS)
    electronsToAdd_ /= 2;
}